

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict
* __thiscall
density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
start_reentrant_emplace<std::__cxx11::string,std::__cxx11::string&>
          (reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict
           *__return_storage_ptr__,
          heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_construction_params)

{
  runtime_type<> *prVar1;
  runtime_type<> rVar2;
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  runtime_type<> *local_40;
  runtime_type<> *type_storage;
  runtime_type<> *type;
  Allocation push_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_construction_params_local;
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  
  push_data.m_user_storage = i_construction_params;
  _type = inplace_allocate<1ul,true,32ul,8ul>(this);
  type_storage = (runtime_type<> *)0x0;
  prVar1 = heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           type_after_control((ControlBlock *)type);
  local_40 = prVar1;
  rVar2 = runtime_type<>::make<std::__cxx11::string>();
  prVar1->m_feature_table = rVar2.m_feature_table;
  type_storage = prVar1;
  std::__cxx11::string::string
            ((string *)push_data.m_control_block,(string *)push_data.m_user_storage);
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::reentrant_put_transaction
            (&local_68,0,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             this,_type);
  reentrant_put_transaction<std::__cxx11::string>::
  reentrant_put_transaction<std::__cxx11::string,void>
            ((reentrant_put_transaction<std::__cxx11::string> *)__return_storage_ptr__,&local_68);
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~reentrant_put_transaction(&local_68);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = inplace_allocate<
              detail::Queue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            RUNTIME_TYPE * type = nullptr;
            try
            {
                auto const type_storage = type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) RUNTIME_TYPE(RUNTIME_TYPE::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                DENSITY_ASSERT_INTERNAL(
                  (push_data.m_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) ==
                  detail::Queue_Busy);
                push_data.m_control_block->m_next += detail::Queue_Dead - detail::Queue_Busy;
                throw;
            }

            return reentrant_put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }